

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O0

void read_32_xrgb_8888_line(ALLEGRO_FILE *f,char *buf,char *data,int length,_Bool premul)

{
  uint32_t uVar1;
  long lVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  uint32_t pixel;
  size_t bytes_read;
  size_t bytes_wanted;
  uint32_t *data32;
  int i;
  undefined4 local_24;
  
  lVar2 = al_fread(in_RDI,in_RSI,(long)(in_ECX << 2));
  memset((void *)(in_RSI + lVar2),0,(in_ECX << 2) - lVar2);
  for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
    uVar1 = read_32le((void *)(in_RSI + (local_24 << 2)));
    *(uint32_t *)(in_RDX + (long)local_24 * 4) =
         (uVar1 & 0xff) << 0x10 | 0xff000000 | uVar1 & 0xff00 | (uVar1 & 0xff0000) >> 0x10;
  }
  return;
}

Assistant:

static void read_32_xrgb_8888_line(ALLEGRO_FILE *f, char *buf, char *data,
   int length, bool premul)
{
   int i;
   uint32_t *data32 = (uint32_t *)data;
   size_t bytes_wanted = length * 4;

   size_t bytes_read = al_fread(f, buf, bytes_wanted);
   memset(buf + bytes_read, 0, bytes_wanted - bytes_read);

   (void)premul;

   for (i = 0; i < length; i++) {
      uint32_t pixel = read_32le(buf + i*4);
      data32[i] = ALLEGRO_CONVERT_XRGB_8888_TO_ABGR_8888_LE(pixel);
   }
}